

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O0

error builtin_greater(vector *vargs,atom *result)

{
  type tVar1;
  undefined4 uVar2;
  int iVar3;
  ulong local_28;
  size_t i;
  atom *result_local;
  vector *vargs_local;
  
  if (vargs->size < 2) {
    uVar2 = sym_t._4_4_;
    result->type = sym_t.type;
    *(undefined4 *)&result->field_0x4 = uVar2;
    result->value = sym_t.value;
    vargs_local._4_4_ = ERROR_OK;
  }
  else {
    tVar1 = vargs->data->type;
    if (tVar1 == T_NUM) {
      for (local_28 = 0; local_28 < vargs->size - 1; local_28 = local_28 + 1) {
        if (vargs->data[local_28].value.number <= vargs->data[local_28 + 1].value.number) {
          result->type = T_NIL;
          *(undefined4 *)&result->field_0x4 = 0;
          result->value = (anon_union_8_9_1d3277aa_for_value)0x0;
          return ERROR_OK;
        }
      }
      uVar2 = sym_t._4_4_;
      result->type = sym_t.type;
      *(undefined4 *)&result->field_0x4 = uVar2;
      result->value = sym_t.value;
      vargs_local._4_4_ = ERROR_OK;
    }
    else if (tVar1 == T_STRING) {
      for (local_28 = 0; local_28 < vargs->size - 1; local_28 = local_28 + 1) {
        iVar3 = strcmp((vargs->data[local_28].value.str)->value,
                       (vargs->data[local_28 + 1].value.str)->value);
        if (iVar3 < 1) {
          result->type = T_NIL;
          *(undefined4 *)&result->field_0x4 = 0;
          result->value = (anon_union_8_9_1d3277aa_for_value)0x0;
          return ERROR_OK;
        }
      }
      uVar2 = sym_t._4_4_;
      result->type = sym_t.type;
      *(undefined4 *)&result->field_0x4 = uVar2;
      result->value = sym_t.value;
      vargs_local._4_4_ = ERROR_OK;
    }
    else {
      vargs_local._4_4_ = ERROR_TYPE;
    }
  }
  return vargs_local._4_4_;
}

Assistant:

error builtin_greater(struct vector *vargs, atom *result)
{
	if (vargs->size <= 1) {
		*result = sym_t;
		return ERROR_OK;
	}
	size_t i;
	switch (vargs->data[0].type) {
	case T_NUM:
		for (i = 0; i < vargs->size - 1; i++) {
			if (vargs->data[i].value.number <= vargs->data[i + 1].value.number) {
				*result = nil;
				return ERROR_OK;
			}
		}
		*result = sym_t;
		return ERROR_OK;
	case T_STRING:
		for (i = 0; i < vargs->size - 1; i++) {
			if (strcmp(vargs->data[i].value.str->value, vargs->data[i + 1].value.str->value) <= 0) {
				*result = nil;
				return ERROR_OK;
			}
		}
		*result = sym_t;
		return ERROR_OK;
	default:
		return ERROR_TYPE;
	}
}